

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  int iVar1;
  _func_int **pp_Var2;
  int __fd;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *in_RCX;
  int iVar5;
  int *piVar6;
  uint64_t file_size;
  size_t local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  _Alloc_hider local_38;
  
  *in_RCX = 0;
  __fd = open((char *)*result,0x80000);
  if (__fd < 0) {
    __errno_location();
    PosixError((string *)this,(int)*result);
  }
  else {
    LOCK();
    piVar6 = (int *)((long)&filename[8].field_2 + 8);
    iVar1 = *piVar6;
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (iVar1 < 1) {
      LOCK();
      piVar6 = (int *)((long)&filename[8].field_2 + 8);
      *piVar6 = *piVar6 + 1;
      UNLOCK();
      puVar4 = (undefined8 *)operator_new(0x38);
      local_78 = &local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*result,
                 (long)&(*result)->_vptr_RandomAccessFile + (long)&result[1]->_vptr_RandomAccessFile
                );
      *puVar4 = &PTR__PosixRandomAccessFile_00131c00;
      LOCK();
      piVar6 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar1 = *piVar6;
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      piVar6 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar5 = __fd;
      if (iVar1 < 1) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
        iVar5 = -1;
      }
      *(bool *)(puVar4 + 1) = 0 < iVar1;
      *(int *)((long)puVar4 + 0xc) = iVar5;
      puVar4[2] = piVar6;
      puVar4[3] = puVar4 + 5;
      if (local_78 == &local_68) {
        puVar4[5] = CONCAT71(uStack_67,local_68);
        puVar4[6] = uStack_60;
      }
      else {
        puVar4[3] = local_78;
        puVar4[5] = CONCAT71(uStack_67,local_68);
      }
      puVar4[4] = local_70;
      local_70 = 0;
      local_68 = 0;
      if (iVar1 < 1) {
        local_78 = &local_68;
        close(__fd);
        *in_RCX = puVar4;
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
        }
      }
      else {
        *in_RCX = puVar4;
      }
      (this->super_Env)._vptr_Env = (_func_int **)0x0;
    }
    else {
      piVar6 = (int *)((long)&filename[8].field_2 + 8);
      (**(code **)((filename->_M_dataplus)._M_p + 0x58))(this,filename,result,&local_80);
      if ((this->super_Env)._vptr_Env == (_func_int **)0x0) {
        pvVar3 = mmap((void *)0x0,local_80,1,1,__fd,0);
        if (pvVar3 == (void *)0xffffffffffffffff) {
          __errno_location();
          PosixError((string *)&local_38,(int)*result);
          pp_Var2 = (this->super_Env)._vptr_Env;
          (this->super_Env)._vptr_Env = (_func_int **)local_38._M_p;
          local_38._M_p = (pointer)pp_Var2;
          if (pp_Var2 != (_func_int **)0x0) {
            operator_delete__(pp_Var2);
          }
        }
        else {
          puVar4 = (undefined8 *)operator_new(0x40);
          local_58 = &local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,*result,
                     (long)&(*result)->_vptr_RandomAccessFile +
                     (long)&result[1]->_vptr_RandomAccessFile);
          *puVar4 = &PTR__PosixMmapReadableFile_00131c28;
          puVar4[1] = pvVar3;
          puVar4[2] = local_80;
          puVar4[3] = piVar6;
          puVar4[4] = puVar4 + 6;
          if (local_58 == &local_48) {
            puVar4[6] = CONCAT71(uStack_47,local_48);
            puVar4[7] = uStack_40;
          }
          else {
            puVar4[4] = local_58;
            puVar4[6] = CONCAT71(uStack_47,local_48);
          }
          puVar4[5] = local_50;
          local_50 = 0;
          local_48 = 0;
          *in_RCX = puVar4;
          local_58 = &local_48;
        }
      }
      close(__fd);
      if ((this->super_Env)._vptr_Env != (_func_int **)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }